

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsCurveGeometry.h
# Opt level: O0

void anurbs::NurbsCurveGeometry<3l>::
     register_python<pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>>
               (module *m,class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model)

{
  char *name_00;
  class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
  *pcVar1;
  arg aVar2;
  undefined1 local_408;
  arg local_400;
  code *local_3f0;
  undefined8 local_3e8;
  arg local_3e0;
  arg local_3d0;
  arg local_3c0;
  arg local_3b0;
  code *local_3a0;
  undefined8 local_398;
  arg local_390;
  arg local_380;
  code *local_370;
  undefined8 local_368;
  arg local_360;
  arg local_350;
  code *local_340;
  undefined8 local_338;
  code *local_330;
  undefined8 local_328;
  code *local_320;
  undefined8 local_318;
  offset_in_Model_to_subr local_308 [2];
  code *local_2f8;
  undefined8 local_2f0;
  code *local_2e8;
  undefined8 local_2e0;
  offset_in_Model_to_subr local_2d0 [2];
  code *local_2c0;
  undefined8 local_2b8;
  code *local_2b0;
  undefined8 local_2a8;
  offset_in_Model_to_subr local_298 [2];
  code *local_288;
  undefined8 local_280;
  code *local_278;
  undefined8 local_270;
  code *local_268;
  undefined8 local_260;
  arg local_258;
  arg local_248;
  arg local_238;
  arg local_228;
  arg local_218;
  arg local_208;
  constructor<const_long,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_std::vector<std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double>_>_>_>
  local_1f1;
  arg local_1f0;
  arg local_1e0;
  arg local_1d0;
  arg local_1c0;
  arg local_1b0;
  arg local_1a0;
  arg local_190;
  arg local_180;
  constructor<const_long,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_169;
  arg local_168;
  arg local_158;
  arg local_148;
  arg local_138;
  arg local_128;
  arg local_118;
  constructor<const_long,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_3,_1,__1,_3>_>
  local_101;
  arg local_100;
  arg local_f0;
  bool local_d9;
  arg_v local_d8;
  arg local_98;
  arg local_88;
  arg local_78;
  arg local_68;
  constructor<const_long,_const_long,_const_bool> local_55 [13];
  handle local_48;
  class_<anurbs::NurbsCurveGeometry<3L>,_anurbs::CurveBase<3L>,_std::shared_ptr<anurbs::NurbsCurveGeometry<3L>_>_>
  local_40;
  string local_38 [8];
  string name;
  class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model_local;
  module *m_local;
  
  name.field_2._8_8_ = model;
  python_name_abi_cxx11_();
  local_48.m_ptr = (m->super_object).super_handle.m_ptr;
  name_00 = (char *)std::__cxx11::string::c_str();
  pybind11::
  class_<anurbs::NurbsCurveGeometry<3L>,_anurbs::CurveBase<3L>,_std::shared_ptr<anurbs::NurbsCurveGeometry<3L>_>_>
  ::class_<>(&local_40,local_48,name_00);
  pybind11::init<long_const,long_const,bool_const>();
  local_78 = pybind11::literals::operator____a("degree",6);
  local_68.name = local_78.name;
  local_68._8_1_ = local_78._8_1_;
  local_98 = pybind11::literals::operator____a("nb_poles",8);
  local_88.name = local_98.name;
  local_88._8_1_ = local_98._8_1_;
  local_d9 = false;
  local_100 = pybind11::literals::operator____a("is_rational",0xb);
  local_f0.name = local_100.name;
  local_f0._8_1_ = local_100._8_1_;
  pybind11::arg::operator=(&local_d8,&local_f0,&local_d9);
  pcVar1 = (class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
              ::def<long_const,long_const,bool_const,pybind11::arg,pybind11::arg,pybind11::arg_v>
                        ((class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
                          *)&local_40,local_55,&local_68,&local_88,&local_d8);
  pybind11::
  init<long_const,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,3,1,_1,3>const>();
  local_128 = pybind11::literals::operator____a("degree",6);
  local_118.name = local_128.name;
  local_118._8_1_ = local_128._8_1_;
  local_148 = pybind11::literals::operator____a("knots",5);
  local_138.name = local_148.name;
  local_138._8_1_ = local_148._8_1_;
  local_168 = pybind11::literals::operator____a("poles",5);
  local_158.name = local_168.name;
  local_158._8_1_ = local_168._8_1_;
  pcVar1 = (class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
              ::
              def<long_const,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,3,1,_1,3>const,pybind11::arg,pybind11::arg,pybind11::arg>
                        (pcVar1,&local_101,&local_118,&local_138,&local_158);
  pybind11::
  init<long_const,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,3,1,_1,3>const,Eigen::Matrix<double,_1,1,0,_1,1>const>
            ();
  local_190 = pybind11::literals::operator____a("degree",6);
  local_180.name = local_190.name;
  local_180._8_1_ = local_190._8_1_;
  local_1b0 = pybind11::literals::operator____a("knots",5);
  local_1a0.name = local_1b0.name;
  local_1a0._8_1_ = local_1b0._8_1_;
  local_1d0 = pybind11::literals::operator____a("poles",5);
  local_1c0.name = local_1d0.name;
  local_1c0._8_1_ = local_1d0._8_1_;
  local_1f0 = pybind11::literals::operator____a("weights",7);
  local_1e0.name = local_1f0.name;
  local_1e0._8_1_ = local_1f0._8_1_;
  pcVar1 = (class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
              ::
              def<long_const,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,3,1,_1,3>const,Eigen::Matrix<double,_1,1,0,_1,1>const,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg>
                        (pcVar1,&local_169,&local_180,&local_1a0,&local_1c0,&local_1e0);
  pybind11::
  init<long_const,Eigen::Matrix<double,_1,1,0,_1,1>const,std::vector<std::pair<Eigen::Matrix<double,1,3,1,1,3>,double>,std::allocator<std::pair<Eigen::Matrix<double,1,3,1,1,3>,double>>>const>
            ();
  local_218 = pybind11::literals::operator____a("degree",6);
  local_208.name = local_218.name;
  local_208._8_1_ = local_218._8_1_;
  local_238 = pybind11::literals::operator____a("knots",5);
  local_228.name = local_238.name;
  local_228._8_1_ = local_238._8_1_;
  local_258 = pybind11::literals::operator____a("control_points",0xe);
  local_248.name = local_258.name;
  local_248._8_1_ = local_258._8_1_;
  pcVar1 = (class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
              ::
              def<long_const,Eigen::Matrix<double,_1,1,0,_1,1>const,std::vector<std::pair<Eigen::Matrix<double,1,3,1,1,3>,double>,std::allocator<std::pair<Eigen::Matrix<double,1,3,1,1,3>,double>>>const,pybind11::arg,pybind11::arg,pybind11::arg>
                        (pcVar1,&local_1f1,&local_208,&local_228,&local_248);
  local_268 = NurbsCurveGeometry<3L>::is_rational;
  local_260 = 0;
  pcVar1 = (class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
              ::def_property_readonly<bool(anurbs::NurbsCurveGeometry<3l>::*)()const>
                        (pcVar1,"is_rational",(offset_in_Model_to_subr *)&local_268);
  local_278 = NurbsCurveGeometry<3L>::nb_knots;
  local_270 = 0;
  pcVar1 = (class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
              ::def_property_readonly<long(anurbs::NurbsCurveGeometry<3l>::*)()const>
                        (pcVar1,"nb_knots",(offset_in_Model_to_subr *)&local_278);
  local_288 = NurbsCurveGeometry<3L>::nb_poles;
  local_280 = 0;
  pcVar1 = (class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
              ::def_property_readonly<long(anurbs::NurbsCurveGeometry<3l>::*)()const>
                        (pcVar1,"nb_poles",(offset_in_Model_to_subr *)&local_288);
  local_2b0 = NurbsCurveGeometry<3L>::knots;
  local_2a8 = 0;
  local_298[0] = pybind11::detail::overload_cast_impl<>::operator()
                           ((overload_cast_impl<> *)&pybind11::overload_cast<>,
                            NurbsCurveGeometry<3L>::knots,0);
  local_2c0 = NurbsCurveGeometry<3L>::set_knots;
  local_2b8 = 0;
  pcVar1 = (class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
              ::
              def_property<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>(anurbs::NurbsCurveGeometry<3l>::*)(),void(anurbs::NurbsCurveGeometry<3l>::*)(Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>)>
                        (pcVar1,"knots",local_298,(offset_in_Model_to_subr *)&local_2c0);
  local_2e8 = NurbsCurveGeometry<3L>::poles;
  local_2e0 = 0;
  local_2d0[0] = pybind11::detail::overload_cast_impl<>::operator()
                           ((overload_cast_impl<> *)&pybind11::overload_cast<>,
                            NurbsCurveGeometry<3L>::poles,0);
  local_2f8 = NurbsCurveGeometry<3L>::set_poles;
  local_2f0 = 0;
  pcVar1 = (class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
              ::
              def_property<Eigen::Ref<Eigen::Matrix<double,_1,3,1,_1,3>,0,Eigen::OuterStride<_1>>(anurbs::NurbsCurveGeometry<3l>::*)(),void(anurbs::NurbsCurveGeometry<3l>::*)(Eigen::Ref<Eigen::Matrix<double,_1,3,1,_1,3>const,0,Eigen::OuterStride<_1>>)>
                        (pcVar1,"poles",local_2d0,(offset_in_Model_to_subr *)&local_2f8);
  local_320 = NurbsCurveGeometry<3L>::weights;
  local_318 = 0;
  local_308[0] = pybind11::detail::overload_cast_impl<>::operator()
                           ((overload_cast_impl<> *)&pybind11::overload_cast<>,
                            NurbsCurveGeometry<3L>::weights,0);
  local_330 = NurbsCurveGeometry<3L>::set_weights;
  local_328 = 0;
  pcVar1 = (class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
              ::
              def_property<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>(anurbs::NurbsCurveGeometry<3l>::*)(),void(anurbs::NurbsCurveGeometry<3l>::*)(Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>)>
                        (pcVar1,"weights",local_308,(offset_in_Model_to_subr *)&local_330);
  local_340 = NurbsCurveGeometry<3L>::greville_point;
  local_338 = 0;
  local_360 = pybind11::literals::operator____a("index",5);
  local_350.name = local_360.name;
  local_350._8_1_ = local_360._8_1_;
  pcVar1 = (class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
              ::def<double(anurbs::NurbsCurveGeometry<3l>::*)(long)const,pybind11::arg>
                        (pcVar1,"greville_point",(offset_in_Model_to_subr *)&local_340,&local_350);
  local_370 = NurbsCurveGeometry<3L>::nonzero_pole_indices_at_span;
  local_368 = 0;
  local_390 = pybind11::literals::operator____a("span",4);
  local_380.name = local_390.name;
  local_380._8_1_ = local_390._8_1_;
  pcVar1 = (class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
              ::
              def<std::vector<long,std::allocator<long>>(anurbs::NurbsCurveGeometry<3l>::*)(long)const,pybind11::arg>
                        (pcVar1,"nonzero_pole_indices_at_span",(offset_in_Model_to_subr *)&local_370
                         ,&local_380);
  local_3a0 = NurbsCurveGeometry<3L>::shape_functions_at;
  local_398 = 0;
  local_3c0 = pybind11::literals::operator____a("t",1);
  local_3b0.name = local_3c0.name;
  local_3b0._8_1_ = local_3c0._8_1_;
  local_3e0 = pybind11::literals::operator____a("order",5);
  local_3d0.name = local_3e0.name;
  local_3d0._8_1_ = local_3e0._8_1_;
  pcVar1 = (class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
              ::
              def<std::pair<std::vector<long,std::allocator<long>>,Eigen::Matrix<double,_1,_1,1,_1,_1>>(anurbs::NurbsCurveGeometry<3l>::*)(double,long)const,pybind11::arg,pybind11::arg>
                        (pcVar1,"shape_functions_at",(offset_in_Model_to_subr *)&local_3a0,
                         &local_3b0,&local_3d0);
  local_3f0 = NurbsCurveGeometry<3L>::span_at;
  local_3e8 = 0;
  aVar2 = pybind11::literals::operator____a("t",1);
  local_400.name = aVar2.name;
  local_408 = aVar2._8_1_;
  local_400._8_1_ = local_408;
  pybind11::
  class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
  ::def<long(anurbs::NurbsCurveGeometry<3l>::*)(double)const,pybind11::arg>
            (pcVar1,"span_at",(offset_in_Model_to_subr *)&local_3f0,&local_400);
  pybind11::arg_v::~arg_v(&local_d8);
  pybind11::
  class_<anurbs::NurbsCurveGeometry<3L>,_anurbs::CurveBase<3L>,_std::shared_ptr<anurbs::NurbsCurveGeometry<3L>_>_>
  ::~class_(&local_40);
  Model::register_python_data_type<anurbs::NurbsCurveGeometry<3l>>
            (m,(class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *)name.field_2._8_8_);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

static void register_python(pybind11::module& m, TModel& model)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Type = NurbsCurveGeometry<TDimension>;
        using Base = CurveBase<TDimension>; 
        using Holder = Pointer<Type>;

        const std::string name = Type::python_name();

        py::class_<Type, Base, Holder>(m, name.c_str())
            // constructors
            .def(py::init<const Index, const Index, const bool>(), "degree"_a, "nb_poles"_a, "is_rational"_a=false)
            .def(py::init<const Index, const Knots, const Poles>(), "degree"_a, "knots"_a, "poles"_a)
            .def(py::init<const Index, const Knots, const Poles, const Weights>(), "degree"_a, "knots"_a, "poles"_a, "weights"_a)
            .def(py::init<const Index, const Knots, const std::vector<ControlPoint>>(), "degree"_a, "knots"_a, "control_points"_a)
            // read-only properties
            .def_property_readonly("is_rational", &Type::is_rational)
            .def_property_readonly("nb_knots", &Type::nb_knots)
            .def_property_readonly("nb_poles", &Type::nb_poles)
            // properties
            .def_property("knots", py::overload_cast<>(&Type::knots), &Type::set_knots)
            .def_property("poles", py::overload_cast<>(&Type::poles), &Type::set_poles)
            .def_property("weights", py::overload_cast<>(&Type::weights), &Type::set_weights)
            // methods
            .def("greville_point", &Type::greville_point, "index"_a)
            .def("nonzero_pole_indices_at_span", &Type::nonzero_pole_indices_at_span, "span"_a)
            .def("shape_functions_at", &Type::shape_functions_at, "t"_a, "order"_a)
            .def("span_at", &Type::span_at, "t"_a)
            // .def("clone", &Type::clone)
        ;

        Model::register_python_data_type<Type>(m, model);
    }